

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_force_ip.cc
# Opt level: O2

void printHelp(ostream *os,string *command)

{
  undefined4 uVar1;
  int iVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::operator<<(os,"Usage: ");
  poVar3 = std::operator<<(os,(string *)command);
  std::operator<<(poVar3," <operation> [<args>]\n");
  std::operator<<(os,'\n');
  std::operator<<(os,"Available operations are:\n");
  iVar2 = getMaxCommandLen<std::__cxx11::string,ResetCommand>(&reset_commands_abi_cxx11_);
  for (p_Var4 = reset_commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &reset_commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    uVar1 = *(undefined4 *)&p_Var4[1]._M_parent;
    poVar3 = std::operator<<(os,"    ");
    std::operator<<(poVar3,(string *)(p_Var4 + 1));
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,((char)iVar2 + '\x03') - (char)uVar1);
    std::operator<<(os,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    poVar3 = std::operator<<(os,(string *)(p_Var4 + 2));
    std::operator<<(poVar3,'\n');
  }
  std::operator<<(os,'\n');
  std::operator<<(os,"Available arguments are:\n");
  std::operator<<(os,"    -h, --help         Show this help and exit\n");
  std::operator<<(os,"    -f name=<name>     Filter by name\n");
  std::operator<<(os,"    -f serial=<serial> Filter by serial number\n");
  std::operator<<(os,"    -f mac=<mac>       Filter by MAC address\n");
  std::operator<<(os,"    -f iface=<mac>     Filter by interface name\n");
  std::operator<<(os,"    -f model=<model>   Filter by model name\n");
  std::operator<<(os,"    -y                 Assume \'yes\' for all queries\n");
  return;
}

Assistant:

static void printHelp(std::ostream &os, const std::string &command)
{
  os << "Usage: ";
  os << command << " [<args>] <IP address> <subnet mask> <default gateway>\n";
  os << '\n';
  os << "-h, --help         Show this help and exit\n";
  os << "-f name=<name>     Filter by name\n";
  os << "-f serial=<serial> Filter by serial number\n";
  os << "-f mac=<mac>       Filter by MAC address\n";
  os << "-f iface=<mac>     Filter by interface name\n";
  os << "-f model=<model>   Filter by model name\n";
  os << "-y                 Assume 'yes' for all queries\n";
}